

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_case_name,string *a_name,char *a_type_param,
          char *a_value_param,CodeLocation *a_code_location,TypeId fixture_class_id,
          TestFactoryBase *factory)

{
  pointer pcVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_t sVar4;
  
  (this->test_case_name_)._M_dataplus._M_p = (pointer)&(this->test_case_name_).field_2;
  pcVar1 = (a_test_case_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + a_test_case_name->_M_string_length);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (a_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + a_name->_M_string_length);
  if (a_type_param == (char *)0x0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar3->_M_dataplus)._M_p = (pointer)&pbVar3->field_2;
    sVar4 = strlen(a_type_param);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pbVar3,a_type_param,a_type_param + sVar4);
  }
  (this->type_param_).ptr_ = pbVar3;
  if (a_value_param == (char *)0x0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar3->_M_dataplus)._M_p = (pointer)&pbVar3->field_2;
    sVar4 = strlen(a_value_param);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pbVar3,a_value_param,a_value_param + sVar4);
  }
  (this->value_param_).ptr_ = pbVar3;
  (this->location_).file._M_dataplus._M_p = (pointer)&(this->location_).file.field_2;
  pcVar2 = (a_code_location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->location_,pcVar2,pcVar2 + (a_code_location->file)._M_string_length);
  (this->location_).line = a_code_location->line;
  this->fixture_class_id_ = fixture_class_id;
  this->should_run_ = false;
  this->is_disabled_ = false;
  this->matches_filter_ = false;
  this->factory_ = factory;
  internal::Mutex::Mutex(&(this->result_).test_properites_mutex_);
  (this->result_).elapsed_time_ = 0;
  (this->result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->result_).death_test_count_ = 0;
  return;
}

Assistant:

TestInfo::TestInfo(const std::string& a_test_case_name,
                   const std::string& a_name,
                   const char* a_type_param,
                   const char* a_value_param,
                   internal::CodeLocation a_code_location,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_case_name_(a_test_case_name),
      name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : NULL),
      value_param_(a_value_param ? new std::string(a_value_param) : NULL),
      location_(a_code_location),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      factory_(factory),
      result_() {}